

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

void __thiscall libchars::debug::initialize__(debug *this)

{
  ulong uVar1;
  char *__filename;
  debug *this_local;
  
  if (_d_ != (FILE *)0x0) {
    fclose(_d_);
    _d_ = (FILE *)0x0;
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __filename = (char *)std::__cxx11::string::c_str();
    _d_ = fopen(__filename,"at");
  }
  else {
    _d_ = fopen(LC_LOG_DEFAULT_FILE,"at");
  }
  this->initialized = true;
  return;
}

Assistant:

void debug::initialize__()
    {
        if (_d_ != NULL) {
            fclose(_d_);
            _d_ = NULL;
        }

        if (!log_path.empty())
            _d_ = fopen(log_path.c_str(), "at");
        else
            _d_ = fopen(LC_LOG_DEFAULT_FILE, "at");

        initialized = true;
    }